

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O2

void __thiscall
OptionParser_ShortFlagCombined_Test::TestBody(OptionParser_ShortFlagCombined_Test *this)

{
  char *message;
  int count;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  AssertionResult gtest_ar;
  char *args [3];
  AssertHelper local_b0;
  OptionParser parser;
  
  count = 0;
  wabt::OptionParser::OptionParser(&parser,"prog","desc");
  args[1] = (char *)0x0;
  args[2] = (char *)std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc:46:38)>
                    ::_M_manager;
  args[0] = (char *)&count;
  wabt::OptionParser::AddOption(&parser,'a',"a","help",(NullCallback *)args);
  if (args[2] != (char *)0x0) {
    (*(code *)args[2])(args,args,3);
  }
  args[1] = (char *)0x0;
  args[2] = (char *)std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc:47:38)>
                    ::_M_manager;
  args[0] = (char *)&count;
  wabt::OptionParser::AddOption(&parser,'b',"b","help",(NullCallback *)args);
  if (args[2] != (char *)0x0) {
    (*(code *)args[2])(args,args,3);
  }
  args[2] = "-abb";
  args[0] = "prog name";
  args[1] = "-aa";
  wabt::OptionParser::Parse(&parser,3,args);
  local_f0.ptr_._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"7","count",(int *)&local_f0,&count)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc"
               ,0x32,message);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  wabt::OptionParser::~OptionParser(&parser);
  return;
}

Assistant:

TEST(OptionParser, ShortFlagCombined) {
  int count = 0;
  OptionParser parser("prog", "desc");
  parser.AddOption('a', "a", "help", [&]() { count += 1; });
  parser.AddOption('b', "b", "help", [&]() { count += 2; });
  const char* args[] = {"prog name", "-aa", "-abb"};
  parser.Parse(3, const_cast<char**>(args));
  EXPECT_EQ(7, count);
}